

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

void __thiscall
btHashedOverlappingPairCache::btHashedOverlappingPairCache(btHashedOverlappingPairCache *this)

{
  (this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
  _vptr_btOverlappingPairCallback = (_func_int **)&PTR__btHashedOverlappingPairCache_001ec400;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (btBroadphasePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  this->m_overlapFilterCallback = (btOverlapFilterCallback *)0x0;
  (this->m_hashTable).m_ownsMemory = true;
  (this->m_hashTable).m_data = (int *)0x0;
  (this->m_hashTable).m_size = 0;
  (this->m_hashTable).m_capacity = 0;
  (this->m_next).m_ownsMemory = true;
  (this->m_next).m_data = (int *)0x0;
  (this->m_next).m_size = 0;
  (this->m_next).m_capacity = 0;
  this->m_ghostPairCallback = (btOverlappingPairCallback *)0x0;
  btAlignedObjectArray<btBroadphasePair>::reserve(&this->m_overlappingPairArray,2);
  growTables(this);
  return;
}

Assistant:

btHashedOverlappingPairCache::btHashedOverlappingPairCache():
	m_overlapFilterCallback(0),
	m_ghostPairCallback(0)
{
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}